

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# j2k.c
# Opt level: O2

OPJ_BOOL opj_j2k_write_com(opj_j2k_t *p_j2k,opj_stream_private_t *p_stream,
                          opj_event_mgr_t *p_manager)

{
  char *__s;
  size_t sVar1;
  OPJ_BYTE *p_buffer;
  OPJ_SIZE_T OVar2;
  uint uVar3;
  ulong new_size;
  
  if (p_j2k == (opj_j2k_t *)0x0) {
    __assert_fail("p_j2k != 00",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/cinecert[P]openjpeg/src/lib/openjp2/j2k.c"
                  ,0x9ca,
                  "OPJ_BOOL opj_j2k_write_com(opj_j2k_t *, opj_stream_private_t *, opj_event_mgr_t *)"
                 );
  }
  if (p_stream != (opj_stream_private_t *)0x0) {
    if (p_manager == (opj_event_mgr_t *)0x0) {
      __assert_fail("p_manager != 00",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/cinecert[P]openjpeg/src/lib/openjp2/j2k.c"
                    ,0x9cc,
                    "OPJ_BOOL opj_j2k_write_com(opj_j2k_t *, opj_stream_private_t *, opj_event_mgr_t *)"
                   );
    }
    __s = (p_j2k->m_cp).comment;
    sVar1 = strlen(__s);
    uVar3 = (int)sVar1 + 6;
    new_size = (ulong)uVar3;
    p_buffer = (p_j2k->m_specific_param).m_encoder.m_header_tile_data;
    if ((p_j2k->m_specific_param).m_encoder.m_header_tile_data_size < uVar3) {
      p_buffer = (OPJ_BYTE *)opj_realloc(p_buffer,new_size);
      if (p_buffer == (OPJ_BYTE *)0x0) {
        opj_free((p_j2k->m_specific_param).m_encoder.m_header_tile_data);
        (p_j2k->m_specific_param).m_encoder.m_header_tile_data = (OPJ_BYTE *)0x0;
        (p_j2k->m_specific_param).m_encoder.m_header_tile_data_size = 0;
        opj_event_msg(p_manager,1,"Not enough memory to write the COM marker\n");
        return 0;
      }
      (p_j2k->m_specific_param).m_encoder.m_header_tile_data = p_buffer;
      (p_j2k->m_specific_param).m_encoder.m_header_tile_data_size = uVar3;
    }
    opj_write_bytes_LE(p_buffer,0xff64,2);
    opj_write_bytes_LE(p_buffer + 2,(int)sVar1 + 4,2);
    opj_write_bytes_LE(p_buffer + 4,1,2);
    memcpy(p_buffer + 6,__s,sVar1 & 0xffffffff);
    OVar2 = opj_stream_write_data
                      (p_stream,(p_j2k->m_specific_param).m_encoder.m_header_tile_data,new_size,
                       p_manager);
    return (uint)(OVar2 == new_size);
  }
  __assert_fail("p_stream != 00",
                "/workspace/llm4binary/github/license_all_cmakelists_25/cinecert[P]openjpeg/src/lib/openjp2/j2k.c"
                ,0x9cb,
                "OPJ_BOOL opj_j2k_write_com(opj_j2k_t *, opj_stream_private_t *, opj_event_mgr_t *)"
               );
}

Assistant:

static OPJ_BOOL opj_j2k_write_com(opj_j2k_t *p_j2k,
                                  opj_stream_private_t *p_stream,
                                  opj_event_mgr_t * p_manager
                                 )
{
    OPJ_UINT32 l_comment_size;
    OPJ_UINT32 l_total_com_size;
    const OPJ_CHAR *l_comment;
    OPJ_BYTE * l_current_ptr = 00;

    /* preconditions */
    assert(p_j2k != 00);
    assert(p_stream != 00);
    assert(p_manager != 00);

    l_comment = p_j2k->m_cp.comment;
    l_comment_size = (OPJ_UINT32)strlen(l_comment);
    l_total_com_size = l_comment_size + 6;

    if (l_total_com_size >
            p_j2k->m_specific_param.m_encoder.m_header_tile_data_size) {
        OPJ_BYTE *new_header_tile_data = (OPJ_BYTE *) opj_realloc(
                                             p_j2k->m_specific_param.m_encoder.m_header_tile_data, l_total_com_size);
        if (! new_header_tile_data) {
            opj_free(p_j2k->m_specific_param.m_encoder.m_header_tile_data);
            p_j2k->m_specific_param.m_encoder.m_header_tile_data = NULL;
            p_j2k->m_specific_param.m_encoder.m_header_tile_data_size = 0;
            opj_event_msg(p_manager, EVT_ERROR,
                          "Not enough memory to write the COM marker\n");
            return OPJ_FALSE;
        }
        p_j2k->m_specific_param.m_encoder.m_header_tile_data = new_header_tile_data;
        p_j2k->m_specific_param.m_encoder.m_header_tile_data_size = l_total_com_size;
    }

    l_current_ptr = p_j2k->m_specific_param.m_encoder.m_header_tile_data;

    opj_write_bytes(l_current_ptr, J2K_MS_COM, 2);  /* COM */
    l_current_ptr += 2;

    opj_write_bytes(l_current_ptr, l_total_com_size - 2, 2);        /* L_COM */
    l_current_ptr += 2;

    opj_write_bytes(l_current_ptr, 1,
                    2);   /* General use (IS 8859-15:1999 (Latin) values) */
    l_current_ptr += 2;

    memcpy(l_current_ptr, l_comment, l_comment_size);

    if (opj_stream_write_data(p_stream,
                              p_j2k->m_specific_param.m_encoder.m_header_tile_data, l_total_com_size,
                              p_manager) != l_total_com_size) {
        return OPJ_FALSE;
    }

    return OPJ_TRUE;
}